

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O2

RangeValue __thiscall CoreML::RangeValue::operator-(RangeValue *this,int other)

{
  undefined8 extraout_RAX;
  RangeValue RVar1;
  RangeValue retval;
  RangeValue local_20;
  
  RangeValue(&local_20);
  if (this->_isUnbound == true) {
    RVar1._1_7_ = (int7)((ulong)extraout_RAX >> 8);
    RVar1._isUnbound = local_20._isUnbound;
    RVar1._val = local_20._val;
  }
  else if (other < 0) {
    RVar1 = operator+(this,(ulong)(uint)-other);
  }
  else {
    RVar1 = operator-(this,(ulong)(uint)other);
  }
  return RVar1;
}

Assistant:

RangeValue RangeValue::operator- (int other) const {
    RangeValue retval;
    if (_isUnbound)
        return retval;
    else if (other < 0) {
        return (*this) + static_cast<size_t>(-1*other);
    }
    else
        return (*this) - static_cast<size_t>(other);
}